

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  size_t _elemsize;
  Allocator *pAVar2;
  Mat *pMVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  pointer pMVar8;
  pointer pMVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  pointer pMVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar9->dims;
  _elemsize = pMVar9->elemsize;
  if (uVar5 == 1) {
    lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar12 == 0) {
      iVar10 = 0;
    }
    else {
      lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      piVar14 = &pMVar9->w;
      iVar10 = 0;
      do {
        iVar10 = iVar10 + *piVar14;
        piVar14 = piVar14 + 0xe;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pAVar2 = opt->blob_allocator;
    if ((((pMVar9->dims == 1) && (pMVar9->w == iVar10)) && (pMVar9->elemsize == _elemsize)) &&
       (pMVar9->allocator == pAVar2)) {
      pvVar6 = pMVar9->data;
      if (pvVar6 != (void *)0x0) {
LAB_0010abae:
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish != pMVar9) {
            lVar12 = 0;
            uVar15 = 0;
            do {
              lVar11 = (long)*(int *)((long)&pMVar9->w + lVar12);
              memcpy(pvVar6,*(void **)((long)&pMVar9->data + lVar12),_elemsize * lVar11);
              pvVar6 = (void *)((long)pvVar6 + lVar11 * 4);
              uVar15 = uVar15 + 1;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar12 = lVar12 + 0x38;
            } while (uVar15 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar9 >> 3) * 0x6db6db6db6db6db7));
          }
          goto LAB_0010ac17;
        }
      }
    }
    else {
      piVar14 = pMVar9->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (pMVar9->allocator == (Allocator *)0x0) {
            if (pMVar9->data != (void *)0x0) {
              free(*(void **)((long)pMVar9->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)pMVar9->allocator + 8))();
          }
        }
      }
      pMVar9->data = (void *)0x0;
      pMVar9->refcount = (int *)0x0;
      pMVar9->elemsize = _elemsize;
      pMVar9->allocator = pAVar2;
      pMVar9->dims = 1;
      pMVar9->w = iVar10;
      pMVar9->h = 1;
      pMVar9->c = 1;
      pMVar9->cstep = (long)iVar10;
      if (iVar10 != 0) {
        uVar15 = (long)iVar10 * _elemsize + 3 & 0xfffffffffffffffc;
        if (pAVar2 == (Allocator *)0x0) {
          pvVar7 = malloc(uVar15 + 0x1c);
          pvVar6 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 + -8) = pvVar7;
        }
        else {
          pvVar6 = (void *)(*(code *)**(undefined8 **)pAVar2)(pAVar2,uVar15 + 4);
        }
        pMVar9->data = pvVar6;
        pMVar9->refcount = (int *)((long)pvVar6 + uVar15);
        *(undefined4 *)((long)pvVar6 + uVar15) = 1;
        goto LAB_0010abae;
      }
    }
    iVar10 = -100;
  }
  else {
    uVar1 = this->axis;
    if ((uVar5 ^ 2) == 0 && uVar1 == 0) {
      iVar10 = pMVar9->w;
      lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar12 == 0) {
        iVar4 = 0;
      }
      else {
        lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        piVar14 = &pMVar9->h;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + *piVar14;
          piVar14 = piVar14 + 0xe;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar10,iVar4,_elemsize,opt->blob_allocator);
      pvVar6 = pMVar3->data;
      if (pvVar6 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar3->c * pMVar3->cstep == 0) {
        return -100;
      }
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar9) {
        lVar12 = 0;
        uVar15 = 0;
        do {
          lVar11 = (long)*(int *)((long)&pMVar9->h + lVar12) * (long)iVar10;
          memcpy(pvVar6,*(void **)((long)&pMVar9->data + lVar12),_elemsize * lVar11);
          pvVar6 = (void *)((long)pvVar6 + lVar11 * 4);
          uVar15 = uVar15 + 1;
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x38;
        } while (uVar15 < (ulong)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >>
                                  3) * 0x6db6db6db6db6db7));
      }
    }
    else if ((uVar5 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      iVar10 = pMVar9->h;
      lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar12 == 0) {
        iVar4 = 0;
      }
      else {
        lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        piVar14 = &pMVar9->w;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + *piVar14;
          piVar14 = piVar14 + 0xe;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar4,iVar10,_elemsize,opt->blob_allocator);
      if (pMVar3->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar3->c * pMVar3->cstep == 0) {
        return -100;
      }
      if (0 < iVar10) {
        iVar4 = 0;
        pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pMVar13 = pMVar9;
          if (pMVar8 != pMVar9) {
            pvVar6 = (void *)((long)pMVar3->w * (long)iVar4 * 4 + (long)pMVar3->data);
            lVar12 = 0x24;
            uVar15 = 0;
            do {
              lVar11 = (long)*(int *)((long)&pMVar13->data + lVar12);
              memcpy(pvVar6,(void *)(lVar11 * iVar4 * 4 + *(long *)((long)pMVar13 + lVar12 + -0x24))
                     ,lVar11 * _elemsize);
              pvVar6 = (void *)((long)pvVar6 + (long)*(int *)((long)&pMVar13->data + lVar12) * 4);
              uVar15 = uVar15 + 1;
              pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              lVar12 = lVar12 + 0x38;
            } while (uVar15 < (ulong)(((long)pMVar9 - (long)pMVar13 >> 3) * 0x6db6db6db6db6db7));
          }
          iVar4 = iVar4 + 1;
          pMVar8 = pMVar9;
          pMVar9 = pMVar13;
        } while (iVar4 != iVar10);
        return 0;
      }
    }
    else {
      uVar5 = uVar5 ^ 3;
      if (uVar5 == 0 && uVar1 == 0) {
        lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
        if (lVar12 == 0) {
          iVar10 = 0;
        }
        else {
          lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
          lVar12 = lVar12 + (ulong)(lVar12 == 0);
          piVar14 = &pMVar9->c;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + *piVar14;
            piVar14 = piVar14 + 0xe;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar9->w,pMVar9->h,iVar10,_elemsize,opt->blob_allocator);
        if (pMVar3->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar3->c * pMVar3->cstep == 0) {
          return -100;
        }
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar9) {
          lVar12 = 0x30;
          iVar10 = 0;
          uVar15 = 0;
          do {
            iVar4 = *(int *)((long)pMVar9 + lVar12 + -4);
            memcpy((void *)(pMVar3->cstep * (long)iVar10 * pMVar3->elemsize + (long)pMVar3->data),
                   *(void **)((long)pMVar9 + lVar12 + -0x30),
                   (long)(*(int *)((long)&pMVar9->data + lVar12) * iVar4) * _elemsize);
            iVar10 = iVar10 + iVar4;
            uVar15 = uVar15 + 1;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x38;
          } while (uVar15 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar9 >> 3) * 0x6db6db6db6db6db7));
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar5 == 0) {
        uVar5 = pMVar9->c;
        lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
        if (lVar12 == 0) {
          iVar10 = 0;
        }
        else {
          lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
          lVar12 = lVar12 + (ulong)(lVar12 == 0);
          piVar14 = &pMVar9->h;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + *piVar14;
            piVar14 = piVar14 + 0xe;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar9->w,iVar10,uVar5,_elemsize,opt->blob_allocator);
        if (pMVar3->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar3->c * pMVar3->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          uVar15 = 0;
          pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            pMVar13 = pMVar9;
            if (pMVar8 != pMVar9) {
              pvVar6 = (void *)(pMVar3->cstep * uVar15 * pMVar3->elemsize + (long)pMVar3->data);
              lVar12 = 0x30;
              uVar16 = 0;
              do {
                lVar11 = (long)*(int *)((long)pMVar13 + lVar12 + -8) *
                         (long)*(int *)((long)pMVar13 + lVar12 + -0xc);
                memcpy(pvVar6,(void *)(*(long *)((long)&pMVar13->data + lVar12) * uVar15 *
                                       *(long *)((long)pMVar13 + lVar12 + -0x20) +
                                      *(long *)((long)pMVar13 + lVar12 + -0x30)),_elemsize * lVar11)
                ;
                pvVar6 = (void *)((long)pvVar6 + lVar11 * 4);
                uVar16 = uVar16 + 1;
                pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                lVar12 = lVar12 + 0x38;
              } while (uVar16 < (ulong)(((long)pMVar9 - (long)pMVar13 >> 3) * 0x6db6db6db6db6db7));
            }
            uVar15 = uVar15 + 1;
            pMVar8 = pMVar9;
            pMVar9 = pMVar13;
          } while (uVar15 != uVar5);
          return 0;
        }
      }
      else if (uVar5 == 0 && uVar1 == 2) {
        iVar10 = pMVar9->h;
        uVar5 = pMVar9->c;
        lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
        if (lVar12 == 0) {
          iVar4 = 0;
        }
        else {
          lVar12 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
          lVar12 = lVar12 + (ulong)(lVar12 == 0);
          piVar14 = &pMVar9->w;
          iVar4 = 0;
          do {
            iVar4 = iVar4 + *piVar14;
            piVar14 = piVar14 + 0xe;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,iVar4,iVar10,uVar5,_elemsize,opt->blob_allocator);
        if (pMVar3->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar3->c * pMVar3->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            if (0 < iVar10) {
              pvVar6 = (void *)(pMVar3->cstep * uVar15 * pMVar3->elemsize + (long)pMVar3->data);
              iVar4 = 0;
              pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                pMVar13 = pMVar9;
                if (pMVar8 != pMVar9) {
                  lVar12 = 0x30;
                  uVar16 = 0;
                  do {
                    lVar11 = (long)*(int *)((long)pMVar13 + lVar12 + -0xc);
                    memcpy(pvVar6,(void *)(*(long *)((long)&pMVar13->data + lVar12) * uVar15 *
                                           *(long *)((long)pMVar13 + lVar12 + -0x20) +
                                           *(long *)((long)pMVar13 + lVar12 + -0x30) +
                                          lVar11 * iVar4 * 4),_elemsize * lVar11);
                    pvVar6 = (void *)((long)pvVar6 +
                                     (long)*(int *)((long)pMVar13 + lVar12 + -0xc) * 4);
                    uVar16 = uVar16 + 1;
                    pMVar13 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar9 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                    lVar12 = lVar12 + 0x38;
                  } while (uVar16 < (ulong)(((long)pMVar9 - (long)pMVar13 >> 3) * 0x6db6db6db6db6db7
                                           ));
                }
                iVar4 = iVar4 + 1;
                pMVar8 = pMVar9;
                pMVar9 = pMVar13;
              } while (iVar4 != iVar10);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar5);
          return 0;
        }
      }
    }
LAB_0010ac17:
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}